

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O0

void __thiscall
spvtools::opt::VectorDCE::FindLiveComponents
          (VectorDCE *this,Function *function,LiveComponentMap *live_components)

{
  bool bVar1;
  Op OVar2;
  ulong uVar3;
  size_type sVar4;
  reference pvVar5;
  WorkListItem local_c0;
  Instruction *local_a0;
  Instruction *current_inst;
  WorkListItem current_item;
  undefined1 auStack_70 [4];
  uint32_t i;
  VectorDCE *local_68;
  pointer local_60;
  function<void_(spvtools::opt::Instruction_*)> local_58;
  undefined1 local_38 [8];
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  work_list;
  LiveComponentMap *live_components_local;
  Function *function_local;
  VectorDCE *this_local;
  
  work_list.
  super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)live_components;
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ::vector((vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
            *)local_38);
  _auStack_70 = (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                 *)local_38;
  local_60 = work_list.
             super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_68 = this;
  std::function<void(spvtools::opt::Instruction*)>::
  function<spvtools::opt::VectorDCE::FindLiveComponents(spvtools::opt::Function*,std::unordered_map<unsigned_int,spvtools::utils::BitVector,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::utils::BitVector>>>*)::__0,void>
            ((function<void(spvtools::opt::Instruction*)> *)&local_58,
             (anon_class_24_3_74505f00 *)auStack_70);
  opt::Function::ForEachInst(function,&local_58,false,false);
  std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_58);
  for (current_item.components.bits_.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uVar3 = (ulong)current_item.components.bits_.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_,
      sVar4 = std::
              vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
              ::size((vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                      *)local_38), uVar3 < sVar4;
      current_item.components.bits_.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ =
           current_item.components.bits_.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._4_4_ + 1) {
    pvVar5 = std::
             vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
             ::operator[]((vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                           *)local_38,
                          (ulong)current_item.components.bits_.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    WorkListItem::WorkListItem((WorkListItem *)&current_inst,pvVar5);
    local_a0 = current_inst;
    OVar2 = opt::Instruction::opcode(current_inst);
    switch(OVar2) {
    case OpVectorShuffle:
      MarkVectorShuffleUsesAsLive
                (this,(WorkListItem *)&current_inst,
                 (LiveComponentMap *)
                 work_list.
                 super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                  *)local_38);
      break;
    case OpCompositeConstruct:
      WorkListItem::WorkListItem(&local_c0,(WorkListItem *)&current_inst);
      MarkCompositeContructUsesAsLive
                (this,&local_c0,
                 (LiveComponentMap *)
                 work_list.
                 super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                  *)local_38);
      WorkListItem::~WorkListItem(&local_c0);
      break;
    case OpCompositeExtract:
      MarkExtractUseAsLive
                (this,local_a0,(BitVector *)&current_item,
                 (LiveComponentMap *)
                 work_list.
                 super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                  *)local_38);
      break;
    case OpCompositeInsert:
      MarkInsertUsesAsLive
                (this,(WorkListItem *)&current_inst,
                 (LiveComponentMap *)
                 work_list.
                 super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                  *)local_38);
      break;
    default:
      bVar1 = opt::Instruction::IsScalarizable(local_a0);
      if (bVar1) {
        MarkUsesAsLive(this,local_a0,(BitVector *)&current_item,
                       (LiveComponentMap *)
                       work_list.
                       super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                        *)local_38);
      }
      else {
        MarkUsesAsLive(this,local_a0,&this->all_components_live_,
                       (LiveComponentMap *)
                       work_list.
                       super__Vector_base<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
                        *)local_38);
      }
    }
    WorkListItem::~WorkListItem((WorkListItem *)&current_inst);
  }
  std::
  vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
  ::~vector((vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
             *)local_38);
  return;
}

Assistant:

void VectorDCE::FindLiveComponents(Function* function,
                                   LiveComponentMap* live_components) {
  std::vector<WorkListItem> work_list;

  // Prime the work list.  We will assume that any instruction that does
  // not result in a vector is live.
  //
  // Extending to structures and matrices is not as straight forward because of
  // the nesting.  We cannot simply us a bit vector to keep track of which
  // components are live because of arbitrary nesting of structs.
  function->ForEachInst(
      [&work_list, this, live_components](Instruction* current_inst) {
        if (current_inst->IsCommonDebugInstr()) {
          return;
        }
        if (!HasVectorOrScalarResult(current_inst) ||
            !context()->IsCombinatorInstruction(current_inst)) {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
      });

  // Process the work list propagating liveness.
  for (uint32_t i = 0; i < work_list.size(); i++) {
    WorkListItem current_item = work_list[i];
    Instruction* current_inst = current_item.instruction;

    switch (current_inst->opcode()) {
      case spv::Op::OpCompositeExtract:
        MarkExtractUseAsLive(current_inst, current_item.components,
                             live_components, &work_list);
        break;
      case spv::Op::OpCompositeInsert:
        MarkInsertUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpVectorShuffle:
        MarkVectorShuffleUsesAsLive(current_item, live_components, &work_list);
        break;
      case spv::Op::OpCompositeConstruct:
        MarkCompositeContructUsesAsLive(current_item, live_components,
                                        &work_list);
        break;
      default:
        if (current_inst->IsScalarizable()) {
          MarkUsesAsLive(current_inst, current_item.components, live_components,
                         &work_list);
        } else {
          MarkUsesAsLive(current_inst, all_components_live_, live_components,
                         &work_list);
        }
        break;
    }
  }
}